

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prio.c
# Opt level: O2

int main(void)

{
  int in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  char *pcVar6;
  char *in_RCX;
  int *piVar7;
  int *address;
  int *address_00;
  ulong uVar8;
  int in_EDX;
  int family;
  int family_00;
  int sock;
  int sock_00;
  int sock_01;
  int family_01;
  int family_02;
  int family_03;
  int sock_02;
  int sock_03;
  int sock_04;
  int family_04;
  int family_05;
  int sock_05;
  int family_06;
  int sock_06;
  int sock_07;
  FILE *__stream;
  undefined8 uStack_40;
  int rcvprio;
  int sndprio;
  
  address = &rcvprio;
  address_00 = &rcvprio;
  rcvprio = in_EAX;
  iVar1 = test_socket_impl((char *)0x2c,0x51,in_EDX,(int)in_RCX);
  test_bind_impl((char *)0x2d,iVar1,0x102107,in_RCX);
  iVar2 = test_socket_impl((char *)0x2e,0x51,family,(int)in_RCX);
  test_bind_impl((char *)0x2f,iVar2,0x102112,in_RCX);
  iVar3 = test_socket_impl((char *)0x30,0x50,family_00,(int)in_RCX);
  piVar7 = &sndprio;
  sndprio = 1;
  iVar4 = nn_setsockopt(iVar3,0,8,piVar7,4);
  __stream = _stderr;
  if (iVar4 == 0) {
    test_connect_impl((char *)0x35,iVar3,0x102107,(char *)piVar7);
    piVar7 = &sndprio;
    sndprio = 2;
    iVar4 = nn_setsockopt(iVar3,0,8,piVar7,4);
    __stream = _stderr;
    if (iVar4 == 0) {
      test_connect_impl((char *)0x3a,iVar3,0x102112,(char *)piVar7);
      test_send_impl((char *)0x3c,iVar3,0x10211d,(char *)piVar7);
      test_send_impl((char *)0x3d,iVar3,0x102121,(char *)piVar7);
      test_recv_impl((char *)0x3e,iVar1,0x10211d,(char *)piVar7);
      test_recv_impl((char *)0x3f,iVar1,0x102121,(char *)piVar7);
      test_close_impl((char *)0x41,iVar1,sock);
      test_close_impl((char *)0x42,iVar3,sock_00);
      test_close_impl((char *)0x43,iVar2,sock_01);
      iVar1 = test_socket_impl((char *)0x47,0x50,family_01,(int)piVar7);
      test_bind_impl((char *)0x48,iVar1,0x102107,(char *)piVar7);
      iVar2 = test_socket_impl((char *)0x49,0x50,family_02,(int)piVar7);
      test_bind_impl((char *)0x4a,iVar2,0x102112,(char *)piVar7);
      iVar3 = test_socket_impl((char *)0x4b,0x51,family_03,(int)piVar7);
      rcvprio = 2;
      iVar4 = nn_setsockopt(iVar3,0,9,&rcvprio,4);
      __stream = _stderr;
      if (iVar4 == 0) {
        test_connect_impl((char *)0x50,iVar3,0x102107,(char *)address);
        rcvprio = 1;
        iVar4 = nn_setsockopt(iVar3,0,9,&rcvprio,4);
        __stream = _stderr;
        if (iVar4 == 0) {
          test_connect_impl((char *)0x55,iVar3,0x102112,(char *)address_00);
          test_send_impl((char *)0x57,iVar1,0x10211d,(char *)address_00);
          test_send_impl((char *)0x58,iVar2,0x102121,(char *)address_00);
          nn_sleep(100);
          test_recv_impl((char *)0x5a,iVar3,0x102121,(char *)address_00);
          test_recv_impl((char *)0x5b,iVar3,0x10211d,(char *)address_00);
          test_close_impl((char *)0x5d,iVar3,sock_02);
          test_close_impl((char *)0x5e,iVar2,sock_03);
          test_close_impl((char *)0x5f,iVar1,sock_04);
          iVar1 = test_socket_impl((char *)0x63,0x50,family_04,(int)address_00);
          test_bind_impl((char *)0x64,iVar1,0x102107,(char *)address_00);
          iVar2 = test_socket_impl((char *)0x65,0x51,family_05,(int)address_00);
          test_connect_impl((char *)0x66,iVar2,0x102107,(char *)address_00);
          test_send_impl((char *)0x68,iVar1,0x10211d,(char *)address_00);
          test_recv_impl((char *)0x69,iVar2,0x10211d,(char *)address_00);
          test_close_impl((char *)0x6a,iVar2,sock_05);
          pcVar6 = (char *)0x1;
          iVar2 = nn_send(iVar1,"ABC",3);
          if (iVar2 == -1) {
            iVar2 = nn_errno();
            if (iVar2 == 0xb) {
              iVar2 = test_socket_impl((char *)0x6f,0x51,family_06,(int)pcVar6);
              test_connect_impl((char *)0x70,iVar2,0x102107,pcVar6);
              test_send_impl((char *)0x72,iVar1,0x10211d,pcVar6);
              test_recv_impl((char *)0x73,iVar2,0x10211d,pcVar6);
              test_close_impl((char *)0x74,iVar2,sock_06);
              test_close_impl((char *)0x75,iVar1,sock_07);
              return 0;
            }
          }
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rc == -1 && nn_errno() == EAGAIN",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c"
                  ,0x6d);
          goto LAB_00101727;
        }
        puVar5 = (uint *)__errno_location();
        pcVar6 = nn_err_strerror(*puVar5);
        uVar8 = (ulong)*puVar5;
        uStack_40 = 0x54;
      }
      else {
        puVar5 = (uint *)__errno_location();
        pcVar6 = nn_err_strerror(*puVar5);
        uVar8 = (ulong)*puVar5;
        uStack_40 = 0x4f;
      }
    }
    else {
      puVar5 = (uint *)__errno_location();
      pcVar6 = nn_err_strerror(*puVar5);
      uVar8 = (ulong)*puVar5;
      uStack_40 = 0x39;
    }
  }
  else {
    puVar5 = (uint *)__errno_location();
    pcVar6 = nn_err_strerror(*puVar5);
    uVar8 = (ulong)*puVar5;
    uStack_40 = 0x34;
  }
  fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar6,uVar8,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/prio.c",
          uStack_40);
LAB_00101727:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int push1;
    int push2;
    int pull1;
    int pull2;
    int sndprio;
    int rcvprio;

    /*  Test send priorities. */

    pull1 = test_socket (AF_SP, NN_PULL);
    test_bind (pull1, SOCKET_ADDRESS_A);
    pull2 = test_socket (AF_SP, NN_PULL);
    test_bind (pull2, SOCKET_ADDRESS_B);
    push1 = test_socket (AF_SP, NN_PUSH);
    sndprio = 1;
    rc = nn_setsockopt (push1, NN_SOL_SOCKET, NN_SNDPRIO,
        &sndprio, sizeof (sndprio));
    errno_assert (rc == 0);
    test_connect (push1, SOCKET_ADDRESS_A);
    sndprio = 2;
    rc = nn_setsockopt (push1, NN_SOL_SOCKET, NN_SNDPRIO,
        &sndprio, sizeof (sndprio));
    errno_assert (rc == 0);
    test_connect (push1, SOCKET_ADDRESS_B);

    test_send (push1, "ABC");
    test_send (push1, "DEF");
    test_recv (pull1, "ABC");
    test_recv (pull1, "DEF");

    test_close (pull1);
    test_close (push1);
    test_close (pull2);

    /*  Test receive priorities. */

    push1 = test_socket (AF_SP, NN_PUSH);
    test_bind (push1, SOCKET_ADDRESS_A);
    push2 = test_socket (AF_SP, NN_PUSH);
    test_bind (push2, SOCKET_ADDRESS_B);
    pull1 = test_socket (AF_SP, NN_PULL);
    rcvprio = 2;
    rc = nn_setsockopt (pull1, NN_SOL_SOCKET, NN_RCVPRIO,
        &rcvprio, sizeof (rcvprio));
    errno_assert (rc == 0);
    test_connect (pull1, SOCKET_ADDRESS_A);
    rcvprio = 1;
    rc = nn_setsockopt (pull1, NN_SOL_SOCKET, NN_RCVPRIO,
        &rcvprio, sizeof (rcvprio));
    errno_assert (rc == 0);
    test_connect (pull1, SOCKET_ADDRESS_B);

    test_send (push1, "ABC");
    test_send (push2, "DEF");
    nn_sleep (100);
    test_recv (pull1, "DEF");
    test_recv (pull1, "ABC");

    test_close (pull1);
    test_close (push2);
    test_close (push1);

    /*  Test removing a pipe from the list. */

    push1 = test_socket (AF_SP, NN_PUSH);
    test_bind (push1, SOCKET_ADDRESS_A);
    pull1 = test_socket (AF_SP, NN_PULL);
    test_connect (pull1, SOCKET_ADDRESS_A);

    test_send (push1, "ABC");
    test_recv (pull1, "ABC");
    test_close (pull1);

    rc = nn_send (push1, "ABC", 3, NN_DONTWAIT);
    nn_assert (rc == -1 && nn_errno() == EAGAIN);

    pull1 = test_socket (AF_SP, NN_PULL);
    test_connect (pull1, SOCKET_ADDRESS_A);

    test_send (push1, "ABC");
    test_recv (pull1, "ABC");
    test_close (pull1);
    test_close (push1);

    return 0;
}